

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_decompress1X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  undefined1 *puVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  ulong *puVar10;
  ulong uVar11;
  bool bVar12;
  ulong *puStack_38;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar3 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar3;
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
    uVar4 = 0;
    uVar11 = 0;
    puVar10 = (ulong *)0x0;
    cSrc = (ulong *)0x0;
    puStack_38 = (ulong *)0x0;
  }
  else {
    puStack_38 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar11 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar11 = uVar11 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar11 = uVar11 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar11 = uVar11 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar11 = uVar11 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar11 = uVar11 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar11 = uVar11 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar2 = 0x1f;
        if (bVar5 != 0) {
          for (; bVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        if (bVar5 == 0) {
          cSrcSize = 0xffffffffffffffec;
          uVar2 = 0;
        }
        else {
          uVar2 = ~uVar2 + (int)cSrcSize * -8 + 0x49;
        }
        uVar4 = (ulong)uVar2;
        puVar10 = (ulong *)cSrc;
      }
    }
    else {
      puVar10 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar11 = *puVar10;
      bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar2 = 0x1f;
      if (bVar5 != 0) {
        for (; bVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = ~uVar2 + 9;
      if (bVar5 == 0) {
        uVar2 = 0;
      }
      uVar4 = (ulong)uVar2;
      cSrcSize = cSrcSize | -(ulong)(bVar5 == 0);
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  puVar1 = (undefined1 *)((long)dst + maxDstSize);
  cVar7 = (char)*(undefined2 *)((long)DTable + 2);
  if (3 < (long)maxDstSize) {
    bVar5 = -cVar7 & 0x3f;
    do {
      uVar2 = (uint)uVar4;
      if (uVar2 < 0x41) {
        if (puVar10 < puStack_38) {
          if (puVar10 == (ulong *)cSrc) goto LAB_007d88ba;
          bVar12 = cSrc <= (ulong *)((long)puVar10 - (uVar4 >> 3));
          uVar8 = (int)puVar10 - (int)cSrc;
          if (bVar12) {
            uVar8 = (uint)(uVar4 >> 3);
          }
          uVar2 = uVar2 + uVar8 * -8;
        }
        else {
          uVar8 = (uint)(uVar4 >> 3);
          uVar2 = uVar2 & 7;
          bVar12 = true;
        }
        uVar4 = (ulong)uVar2;
        puVar10 = (ulong *)((long)puVar10 - (ulong)uVar8);
        uVar11 = *puVar10;
      }
      else {
LAB_007d88ba:
        bVar12 = false;
      }
      if ((puVar1 + -3 <= dst) || (!bVar12)) goto LAB_007d89eb;
      if (cVar7 == '\0') goto LAB_007d8a4c;
      uVar6 = (uVar11 << ((byte)uVar4 & 0x3f)) >> bVar5;
      iVar9 = (uint)*(byte *)((long)DTable + uVar6 * 2 + 4) + (int)uVar4;
      uVar4 = (uVar11 << ((byte)iVar9 & 0x3f)) >> bVar5;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar6 * 2 + 5);
      iVar9 = (uint)*(byte *)((long)DTable + uVar4 * 2 + 4) + iVar9;
      uVar6 = (uVar11 << ((byte)iVar9 & 0x3f)) >> bVar5;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar4 * 2 + 5);
      iVar9 = (uint)*(byte *)((long)DTable + uVar6 * 2 + 4) + iVar9;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar6 * 2 + 5);
      uVar6 = (uVar11 << ((byte)iVar9 & 0x3f)) >> bVar5;
      uVar4 = (ulong)((uint)*(byte *)((long)DTable + uVar6 * 2 + 4) + iVar9);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar6 * 2 + 5);
      dst = (void *)((long)dst + 4);
    } while( true );
  }
  uVar2 = (uint)uVar4;
  if (uVar2 < 0x41) {
    if (puVar10 < puStack_38) {
      if (puVar10 == (ulong *)cSrc) goto LAB_007d89eb;
      uVar8 = (int)puVar10 - (int)cSrc;
      if (cSrc <= (ulong *)((long)puVar10 - (uVar4 >> 3))) {
        uVar8 = (uint)(uVar4 >> 3);
      }
      uVar2 = uVar2 + uVar8 * -8;
    }
    else {
      uVar8 = (uint)(uVar4 >> 3);
      uVar2 = uVar2 & 7;
    }
    uVar4 = (ulong)uVar2;
    puVar10 = (ulong *)((long)puVar10 - (ulong)uVar8);
    uVar11 = *puVar10;
  }
LAB_007d89eb:
  uVar2 = (uint)uVar4;
  if (dst < puVar1) {
    if (cVar7 == '\0') {
LAB_007d8a4c:
      __assert_fail("nbBits >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                    ,0x15d,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
    }
    do {
      uVar6 = (uVar11 << ((byte)uVar4 & 0x3f)) >> (-cVar7 & 0x3fU);
      uVar2 = (int)uVar4 + (uint)*(byte *)((long)DTable + uVar6 * 2 + 4);
      uVar4 = (ulong)uVar2;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar6 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < puVar1);
  }
  if (uVar2 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puVar10 != (ulong *)cSrc) {
    maxDstSize = 0xffffffffffffffec;
  }
  return maxDstSize;
}

Assistant:

size_t HUF_decompress1X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}